

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  ostream *stream;
  ColourImpl *pCVar2;
  pointer pMVar3;
  Code CVar4;
  Code CVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  ostream *poVar10;
  long lVar11;
  Code CVar12;
  pointer pMVar13;
  long local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 local_a0 [40];
  size_t local_78;
  ConsoleReporter *local_68;
  string local_60;
  ColourGuard local_40;
  
  iVar8 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  bVar6 = 1;
  if (((char)iVar8 == '\0') &&
     ((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
      (OVar1 & FailureBit) == Ok ||
      (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    bVar6 = 0;
    if ((OVar1 != ExplicitSkip) && (bVar6 = 0, OVar1 != Warning)) {
      return;
    }
  }
  lazyPrint(this);
  stream = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  pCVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  OVar1 = (_assertionStats->assertionResult).m_resultData.resultType;
  CVar12 = None;
  local_b0 = "";
  CVar4 = BrightRed;
  CVar5 = Green;
  switch(OVar1) {
  case Ok:
    lVar11 = (long)(_assertionStats->infoMessages).
                   super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(_assertionStats->infoMessages).
                   super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_a8 = "PASSED";
    if (lVar11 != 0x48) {
      local_b0 = "";
      local_b8 = 0;
      if (1 < (ulong)(lVar11 / 0x48)) {
        local_b0 = "with messages";
        local_b8 = 0xd;
      }
LAB_0015da16:
      lVar11 = 6;
      CVar12 = CVar5;
      break;
    }
    lVar11 = 6;
    CVar12 = CVar5;
    goto LAB_0015d873;
  case Info:
    local_b8 = 4;
    local_b0 = "info";
    goto LAB_0015d89b;
  case Warning:
    local_b8 = 7;
    local_b0 = "warning";
LAB_0015d89b:
    local_a8 = "";
    CVar12 = None;
    lVar11 = 0;
    break;
  case Warning|Info:
  case ExplicitSkip|Info:
  case ExplicitSkip|Warning:
  case ExplicitSkip|Warning|Info:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    local_a8 = "";
    lVar11 = 0;
    local_b8 = 0;
    break;
  case ExplicitSkip:
    lVar9 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    lVar11 = 7;
    CVar12 = FileName;
    local_a8 = "SKIPPED";
    if (lVar9 != 0x48) {
      local_b0 = "";
      local_b8 = 0;
      if (1 < (ulong)(lVar9 / 0x48)) {
        local_b0 = "explicitly with messages";
        local_b8 = 0x18;
      }
      break;
    }
    goto LAB_0015d8d8;
  case ExpressionFailed:
    bVar7 = ((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0;
    CVar12 = CVar5;
    if (bVar7) {
      CVar12 = BrightRed;
    }
    local_a8 = "FAILED - but was ok";
    if (bVar7) {
      local_a8 = "FAILED";
    }
    lVar11 = 0x13;
    if (bVar7) {
      lVar11 = 6;
    }
    lVar9 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar9 != 0x48) {
      local_b0 = "";
      local_b8 = 0;
      if (1 < (ulong)(lVar9 / 0x48)) {
        local_b0 = "with messages";
        local_b8 = 0xd;
      }
      break;
    }
LAB_0015d873:
    local_b0 = "with message";
    local_b8 = 0xc;
    break;
  case ExplicitFailure:
    local_a8 = "FAILED";
    lVar11 = (long)(_assertionStats->infoMessages).
                   super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(_assertionStats->infoMessages).
                   super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar11 != 0x48) {
      local_b0 = "";
      local_b8 = 0;
      if (1 < (ulong)(lVar11 / 0x48)) {
        local_b0 = "explicitly with messages";
        local_b8 = 0x18;
      }
LAB_0015da13:
      local_a8 = "FAILED";
      CVar5 = CVar4;
      goto LAB_0015da16;
    }
    lVar11 = 6;
    CVar12 = CVar4;
LAB_0015d8d8:
    local_b8 = 0x17;
    local_b0 = "explicitly with message";
    break;
  default:
    if (OVar1 != Exception) {
      if (OVar1 == ThrewException) {
        lVar11 = ((long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(_assertionStats->infoMessages).
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x48;
        if (lVar11 == 0) {
          local_b8 = 0x21;
          local_b0 = "due to unexpected exception with ";
        }
        else if (lVar11 == 1) {
          local_b8 = 0x28;
          local_b0 = "due to unexpected exception with message";
        }
        else {
          local_b8 = 0x29;
          local_b0 = "due to unexpected exception with messages";
        }
      }
      else if (OVar1 == DidntThrowException) {
        local_b8 = 0x36;
        local_b0 = "because no exception was thrown where one was expected";
      }
      else {
        local_a8 = "";
        lVar11 = 0;
        local_b8 = 0;
        if (OVar1 != FatalErrorCondition) break;
        local_b8 = 0x1e;
        local_b0 = "due to a fatal error condition";
      }
      goto LAB_0015da13;
    }
  case Unknown:
  case FailureBit:
    lVar11 = 0x14;
    local_a8 = "** internal error **";
    local_b8 = 0;
    CVar12 = CVar4;
  }
  local_a0._8_4_ = FileName;
  local_a0[0xc] = false;
  local_a0._0_8_ = pCVar2;
  local_68 = this;
  ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_a0,stream);
  local_60._M_dataplus._M_p = (_assertionStats->assertionResult).m_info.lineInfo.file;
  local_60._M_string_length = (_assertionStats->assertionResult).m_info.lineInfo.line;
  Catch::operator<<(stream,(SourceLineInfo *)&local_60);
  std::operator<<(stream,": ");
  ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)local_a0);
  if ((_assertionStats->totals).assertions.failed + (_assertionStats->totals).assertions.passed +
      (_assertionStats->totals).assertions.failedButOk +
      (_assertionStats->totals).assertions.skipped == 0) {
    std::operator<<(stream,'\n');
  }
  else {
    if (lVar11 != 0) {
      local_a0[0xc] = false;
      local_a0._0_8_ = pCVar2;
      local_a0._8_4_ = CVar12;
      ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_a0,stream);
      poVar10 = (ostream *)std::ostream::write((char *)stream,(long)local_a8);
      std::operator<<(poVar10,":\n");
      ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)local_a0);
    }
    if ((_assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
      local_60._M_string_length = CONCAT35(local_60._M_string_length._5_3_,5);
      local_60._M_dataplus._M_p = (pointer)pCVar2;
      ColourImpl::ColourGuard::engageImpl((ColourGuard *)&local_60,stream);
      poVar10 = std::operator<<(stream,"  ");
      AssertionResult::getExpressionInMacro_abi_cxx11_
                ((string *)local_a0,&_assertionStats->assertionResult);
      poVar10 = std::operator<<(poVar10,(string *)local_a0);
      std::operator<<(poVar10,'\n');
      std::__cxx11::string::~string((string *)local_a0);
      ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&local_60);
    }
    bVar7 = AssertionResult::hasExpandedExpression(&_assertionStats->assertionResult);
    if (bVar7) {
      std::operator<<(stream,"with expansion:\n");
      local_40.m_code = BrightYellow;
      local_40.m_engaged = false;
      local_40.m_colourImpl = pCVar2;
      ColourImpl::ColourGuard::engageImpl(&local_40,stream);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_60,&_assertionStats->assertionResult)
      ;
      TextFlow::Column::Column((Column *)local_a0,&local_60);
      local_78 = 2;
      TextFlow::operator<<(stream,(Column *)local_a0);
      std::operator<<(stream,'\n');
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)&local_60);
      ColourImpl::ColourGuard::~ColourGuard(&local_40);
    }
  }
  if (local_b8 != 0) {
    poVar10 = (ostream *)std::ostream::write((char *)stream,(long)local_b0);
    poVar10 = std::operator<<(poVar10,':');
    std::operator<<(poVar10,'\n');
  }
  pMVar3 = (_assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar13 = (_assertionStats->infoMessages).
                 super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl
                 .super__Vector_impl_data._M_start; pMVar13 != pMVar3; pMVar13 = pMVar13 + 1) {
    if ((bool)(pMVar13->type != Info | bVar6)) {
      TextFlow::Column::Column((Column *)local_a0,&pMVar13->message);
      local_78 = 2;
      TextFlow::operator<<(stream,(Column *)local_a0);
      std::operator<<(stream,'\n');
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  std::operator<<((local_68->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
  std::ostream::flush();
  return;
}

Assistant:

void ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    // TODO: Make configurable whether skips should be printed
    if (!includeResults && result.getResultType() != ResultWas::Warning && result.getResultType() != ResultWas::ExplicitSkip)
        return;

    lazyPrint();

    ConsoleAssertionPrinter printer(m_stream, _assertionStats, m_colour.get(), includeResults);
    printer.print();
    m_stream << '\n' << std::flush;
}